

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O3

optional<std::pair<XOnlyPubKey,_bool>_> * __thiscall
XOnlyPubKey::CreateTapTweak
          (optional<std::pair<XOnlyPubKey,_bool>_> *__return_storage_ptr__,XOnlyPubKey *this,
          uint256 *merkle_root)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  int parity;
  secp256k1_xonly_pubkey out_xonly;
  pair<XOnlyPubKey,_bool> ret;
  uint256 tweak;
  secp256k1_pubkey out;
  secp256k1_xonly_pubkey base_point;
  uint local_13c;
  secp256k1_xonly_pubkey local_138;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8;
  uint256 local_d0;
  secp256k1_pubkey local_b0;
  secp256k1_xonly_pubkey local_70;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = secp256k1_xonly_pubkey_parse(secp256k1_context_static,&local_70,(uchar *)this);
  if (iVar2 != 0) {
    ComputeTapTweakHash(&local_d0,this,merkle_root);
    iVar2 = secp256k1_xonly_pubkey_tweak_add
                      (secp256k1_context_static,&local_b0,&local_70,(uchar *)&local_d0);
    if (iVar2 != 0) {
      local_13c = 0xffffffff;
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_d8 = 0;
      iVar2 = secp256k1_xonly_pubkey_from_pubkey
                        (secp256k1_context_static,&local_138,(int *)&local_13c,&local_b0);
      if (iVar2 == 0) {
        bVar1 = false;
      }
      else {
        secp256k1_xonly_pubkey_serialize(secp256k1_context_static,(uchar *)&local_f8,&local_138);
        if (1 < local_13c) {
          __assert_fail("parity == 0 || parity == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pubkey.cpp"
                        ,0x10c,
                        "std::optional<std::pair<XOnlyPubKey, bool>> XOnlyPubKey::CreateTapTweak(const uint256 *) const"
                       );
        }
        local_d8 = (undefined1)local_13c;
        (__return_storage_ptr__->super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>).
        _M_payload.super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._M_value.
        second = (bool)local_d8;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>)._M_payload.
                 super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload + 0x10) =
             local_e8;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>)._M_payload.
                 super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload + 0x18) =
             uStack_e0;
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>).
          _M_payload.super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload =
             local_f8;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>)._M_payload.
                 super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload + 8) =
             uStack_f0;
        bVar1 = true;
      }
      (__return_storage_ptr__->super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>).
      _M_payload.super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_engaged = bVar1;
      goto LAB_00758252;
    }
  }
  (__return_storage_ptr__->super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_engaged = false;
LAB_00758252:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<XOnlyPubKey, bool>> XOnlyPubKey::CreateTapTweak(const uint256* merkle_root) const
{
    secp256k1_xonly_pubkey base_point;
    if (!secp256k1_xonly_pubkey_parse(secp256k1_context_static, &base_point, data())) return std::nullopt;
    secp256k1_pubkey out;
    uint256 tweak = ComputeTapTweakHash(merkle_root);
    if (!secp256k1_xonly_pubkey_tweak_add(secp256k1_context_static, &out, &base_point, tweak.data())) return std::nullopt;
    int parity = -1;
    std::pair<XOnlyPubKey, bool> ret;
    secp256k1_xonly_pubkey out_xonly;
    if (!secp256k1_xonly_pubkey_from_pubkey(secp256k1_context_static, &out_xonly, &parity, &out)) return std::nullopt;
    secp256k1_xonly_pubkey_serialize(secp256k1_context_static, ret.first.begin(), &out_xonly);
    assert(parity == 0 || parity == 1);
    ret.second = parity;
    return ret;
}